

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatbase.c
# Opt level: O3

int ecx_LWR(ecx_portt *port,uint32 LogAdr,uint16 length,void *data,int timeout)

{
  uint8 *puVar1;
  uint uVar2;
  int iVar3;
  undefined6 in_register_00000012;
  uint8 *frameP;
  uint idx;
  ulong __n;
  
  __n = CONCAT62(in_register_00000012,length) & 0xffffffff;
  uVar2 = ecx_getindex(port);
  idx = uVar2 & 0xff;
  *(uint16 *)(port->txbuf[idx] + 0xe) = length + 0x100c;
  port->txbuf[idx][0x10] = '\v';
  port->txbuf[idx][0x11] = (uint8)uVar2;
  *(uint32 *)(port->txbuf[idx] + 0x12) = LogAdr;
  *(short *)(port->txbuf[idx] + 0x16) = (short)__n;
  if ((int)CONCAT62(in_register_00000012,length) != 0) {
    memcpy(port->txbuf[idx] + 0x1a,data,__n);
  }
  puVar1 = port->txbuf[idx] + __n + 0x1a;
  puVar1[0] = '\0';
  puVar1[1] = '\0';
  port->txbuflength[idx] = length + 0x1c;
  iVar3 = ecx_srconfirm(port,idx,timeout);
  ecx_setbufstat(port,idx,0);
  return iVar3;
}

Assistant:

int ecx_LWR(ecx_portt *port, uint32 LogAdr, uint16 length, void *data, int timeout)
{
   uint8 idx;
   int wkc;

   idx = ecx_getindex(port);
   ecx_setupdatagram(port, &(port->txbuf[idx]), EC_CMD_LWR, idx, LO_WORD(LogAdr), HI_WORD(LogAdr), length, data);
   wkc = ecx_srconfirm(port, idx, timeout);
   ecx_setbufstat(port, idx, EC_BUF_EMPTY);

   return wkc;
}